

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

ptrdiff_t __thiscall pugi::xml_node::offset_debug(xml_node *this)

{
  char_t *pcVar1;
  xml_node_type xVar2;
  xml_node xVar3;
  xml_node *local_50;
  xml_node *local_48;
  char_t *buffer;
  xml_node_struct *r;
  xml_node *this_local;
  
  xVar3 = root(this);
  if (xVar3._root == (xml_node_struct *)0x0) {
    return -1;
  }
  pcVar1 = xVar3._root[1].name;
  if (pcVar1 == (char_t *)0x0) {
    return -1;
  }
  xVar2 = type(this);
  if (xVar2 == node_document) {
    return 0;
  }
  if (xVar2 == node_element) {
LAB_0026106c:
    if ((this->_root->header & 0x10) == 0) {
      local_48 = (xml_node *)(this->_root->name + -(long)pcVar1);
    }
    else {
      local_48 = (xml_node *)0xffffffffffffffff;
    }
    this_local = local_48;
  }
  else {
    if (2 < xVar2 - node_pcdata) {
      if (xVar2 - node_pi < 2) goto LAB_0026106c;
      if (xVar2 != node_doctype) {
        return -1;
      }
    }
    if ((this->_root->header & 8) == 0) {
      local_50 = (xml_node *)(this->_root->value + -(long)pcVar1);
    }
    else {
      local_50 = (xml_node *)0xffffffffffffffff;
    }
    this_local = local_50;
  }
  return (ptrdiff_t)this_local;
}

Assistant:

PUGI__FN ptrdiff_t xml_node::offset_debug() const
	{
		xml_node_struct* r = root()._root;

		if (!r) return -1;

		const char_t* buffer = static_cast<impl::xml_document_struct*>(r)->buffer;

		if (!buffer) return -1;

		switch (type())
		{
		case node_document:
			return 0;

		case node_element:
		case node_declaration:
		case node_pi:
			return (_root->header & impl::xml_memory_page_name_allocated_mask) ? -1 : _root->name - buffer;

		case node_pcdata:
		case node_cdata:
		case node_comment:
		case node_doctype:
			return (_root->header & impl::xml_memory_page_value_allocated_mask) ? -1 : _root->value - buffer;

		default:
			return -1;
		}
	}